

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

ItemType HN::getItemType(ItemData *itemData)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  mapped_type *pmVar6;
  allocator<char> *in_RDI;
  mapped_type strType;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  key_type *__k;
  undefined7 in_stack_ffffffffffffff40;
  allocator<char> *__s;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string local_98 [32];
  string local_78 [32];
  _Self local_58 [3];
  allocator<char> local_39;
  string local_38 [32];
  _Self local_18 [2];
  ItemType local_4;
  
  __s = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),(char *)__s,in_RDI);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff18,(key_type *)0x115cfb);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff18);
  bVar1 = std::operator==(local_18,local_58);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if ((bVar1 & 1) == 0) {
    __k = (key_type *)&stack0xffffffffffffff67;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),(char *)__s,in_RDI);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(bVar1,in_stack_ffffffffffffff40),__k);
    std::__cxx11::string::string(local_78,(string *)pmVar6);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff27,
                                     CONCAT16(in_stack_ffffffffffffff26,
                                              CONCAT15(in_stack_ffffffffffffff25,
                                                       CONCAT14(in_stack_ffffffffffffff24,
                                                                in_stack_ffffffffffffff20)))),
                            (char *)in_stack_ffffffffffffff18);
    if ((bool)uVar2) {
      local_4 = Story;
    }
    else {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff26,
                                                      CONCAT15(in_stack_ffffffffffffff25,
                                                               CONCAT14(in_stack_ffffffffffffff24,
                                                                        in_stack_ffffffffffffff20)))
                                      ),(char *)in_stack_ffffffffffffff18);
      if ((bool)uVar3) {
        local_4 = Comment;
      }
      else {
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff25,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20)))),
                                (char *)in_stack_ffffffffffffff18);
        if ((bool)uVar4) {
          local_4 = Job;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20)))),
                                  (char *)in_stack_ffffffffffffff18);
          if (bVar5) {
            local_4 = Poll;
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(bVar5,
                                                  in_stack_ffffffffffffff20)))),
                                    (char *)in_stack_ffffffffffffff18);
            if (bVar5) {
              local_4 = PollOpt;
            }
            else {
              local_4 = Unknown;
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_78);
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

ItemType getItemType(const ItemData & itemData) {
        if (itemData.find("type") == itemData.end()) return ItemType::Unknown;

        auto strType = itemData.at("type");

        if (strType == "story") return ItemType::Story;
        if (strType == "comment") return ItemType::Comment;
        if (strType == "job") return ItemType::Job;
        if (strType == "poll") return ItemType::Poll;
        if (strType == "pollopt") return ItemType::PollOpt;

        return ItemType::Unknown;
    }